

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

void __thiscall
passthrough_resampler<float>::drop_audio_if_needed(passthrough_resampler<float> *this)

{
  uint uVar1;
  uint uVar3;
  ulong uVar4;
  uint uVar2;
  
  uVar3 = this->sample_rate / 0x14;
  uVar4 = (ulong)(this->super_processor).channels;
  uVar2 = (uint)((this->internal_input_buffer).length_ / uVar4);
  uVar1 = uVar2 - uVar3;
  if (uVar3 <= uVar2 && uVar1 != 0) {
    auto_array<float>::pop(&this->internal_input_buffer,(float *)0x0,uVar1 * uVar4);
    return;
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }